

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int setjitmode(lua_State *L,int mode)

{
  TValue *pTVar1;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar2;
  long lVar3;
  int iVar4;
  
  pTVar1 = L->base;
  iVar4 = 0;
  if ((pTVar1 != L->top) && (pTVar1->it64 != -1)) {
    lVar3 = pTVar1->it64 >> 0x2f;
    iVar4 = 1;
    if (1 < lVar3 + 9U) {
      if (lVar3 != -3) goto LAB_0015c0ba;
      iVar4 = 0;
    }
    if ((pTVar1 + 1 < L->top) && (aVar2 = pTVar1[1].field_4, ((long)aVar2 >> 0x2f) + 3U < 2)) {
      mode = mode | (aVar2.it >> 0xf == 0x1fffe) + 3;
    }
    else {
      mode = mode | 2;
    }
  }
  iVar4 = luaJIT_setmode(L,iVar4,mode);
  if (iVar4 == 1) {
    return 1;
  }
  if ((char)mode == '\0') {
    lj_err_caller(L,LJ_ERR_NOJIT);
  }
LAB_0015c0ba:
  lj_err_argt(L,1,6);
}

Assistant:

static int setjitmode(lua_State *L, int mode)
{
  int idx = 0;
  if (L->base == L->top || tvisnil(L->base)) {  /* jit.on/off/flush([nil]) */
    mode |= LUAJIT_MODE_ENGINE;
  } else {
    /* jit.on/off/flush(func|proto, nil|true|false) */
    if (tvisfunc(L->base) || tvisproto(L->base))
      idx = 1;
    else if (!tvistrue(L->base))  /* jit.on/off/flush(true, nil|true|false) */
      goto err;
    if (L->base+1 < L->top && tvisbool(L->base+1))
      mode |= boolV(L->base+1) ? LUAJIT_MODE_ALLFUNC : LUAJIT_MODE_ALLSUBFUNC;
    else
      mode |= LUAJIT_MODE_FUNC;
  }
  if (luaJIT_setmode(L, idx, mode) != 1) {
    if ((mode & LUAJIT_MODE_MASK) == LUAJIT_MODE_ENGINE)
      lj_err_caller(L, LJ_ERR_NOJIT);
  err:
    lj_err_argt(L, 1, LUA_TFUNCTION);
  }
  return 0;
}